

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateInitSavedDefaultCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  _Self local_60 [3];
  allocator<char> local_41;
  key_type local_40;
  _Self local_20;
  Printer *local_18;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"default_constant",&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->variables_,&local_40);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->variables_);
  bVar1 = std::operator!=(&local_20,local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar1) {
    io::Printer::Print(local_18,&this->variables_,"$default_constant$ = $default_constant_value$;\n"
                      );
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::GenerateInitSavedDefaultCode(io::Printer* printer) const {
  if (variables_.find("default_constant") != variables_.end()) {
    printer->Print(variables_,
      "$default_constant$ = $default_constant_value$;\n");
  }
}